

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

MapcodeError
convertCoordsToMicrosAndFractions
          (Point32 *coord32,int *fracLat,int *fracLon,double latDeg,double lonDeg)

{
  MapcodeError MVar1;
  int iVar2;
  double dVar3;
  
  MVar1 = ERR_BAD_COORDINATE;
  if ((((latDeg != NAN) && (lonDeg != -INFINITY)) && (lonDeg != INFINITY)) && (lonDeg != NAN)) {
    dVar3 = -90.0;
    if ((-90.0 <= latDeg) && (dVar3 = latDeg, 90.0 < latDeg)) {
      dVar3 = 90.0;
    }
    dVar3 = floor((dVar3 + 90.0) * 810000000000.0 + 0.1);
    iVar2 = (int)(dVar3 / 810000.0);
    coord32->latMicroDeg = iVar2;
    if (fracLat != (int *)0x0) {
      *fracLat = (int)(dVar3 + (double)iVar2 * -810000.0);
      iVar2 = coord32->latMicroDeg;
    }
    coord32->latMicroDeg = iVar2 + -90000000;
    dVar3 = floor(lonDeg / 360.0);
    dVar3 = floor((dVar3 * -360.0 + lonDeg) * 3240000000000.0 + 0.1);
    iVar2 = (int)(dVar3 / 3240000.0);
    coord32->lonMicroDeg = iVar2;
    if (fracLon != (int *)0x0) {
      *fracLon = (int)(dVar3 + (double)iVar2 * -3240000.0);
      iVar2 = coord32->lonMicroDeg;
    }
    MVar1 = ERR_OK;
    if (179999999 < iVar2) {
      coord32->lonMicroDeg = iVar2 + -360000000;
    }
  }
  return MVar1;
}

Assistant:

static enum MapcodeError
convertCoordsToMicrosAndFractions(Point32 *coord32, int *fracLat, int *fracLon, double latDeg, double lonDeg) {
    double frac;
    ASSERT(coord32);
    if (memcmp(&lonDeg, DOUBLE_NAN, 8) == 0 || memcmp(&lonDeg, DOUBLE_INF, 8) == 0 ||
        memcmp(&lonDeg, DOUBLE_MIN_INF, 8) == 0 ||
        memcmp(&latDeg, DOUBLE_NAN, 8) == 0) {
        return ERR_BAD_COORDINATE;
    }
    if (latDeg < -90) {
        latDeg = -90;
    } else if (latDeg > 90) {
        latDeg = 90;
    }
    latDeg += 90; // lat now [0..180]
    ASSERT((0.0 <= latDeg) && (latDeg <= 180.0));
    latDeg *= (double) 810000000000;
    frac = floor(latDeg + 0.1);
    coord32->latMicroDeg = (int) (frac / (double) 810000);
    if (fracLat) {
        frac -= ((double) coord32->latMicroDeg * (double) 810000);
        *fracLat = (int) frac;
    }
    coord32->latMicroDeg -= 90000000;

    lonDeg -= (360.0 * floor(lonDeg / 360)); // lon now in [0..360>
    ASSERT((0.0 <= lonDeg) && (lonDeg < 360.0));
    lonDeg *= (double) 3240000000000;
    frac = floor(lonDeg + 0.1);
    coord32->lonMicroDeg = (int) (frac / (double) 3240000);
    if (fracLon) {
        frac -= (double) coord32->lonMicroDeg * (double) 3240000;
        *fracLon = (int) frac;
    }
    if (coord32->lonMicroDeg >= 180000000) {
        coord32->lonMicroDeg -= 360000000;
    }
    return ERR_OK;
}